

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint64_t DoBenchmark(Function ToBenchmark,uint64_t Size)

{
  string sVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uniform_int_distribution<int> RandomChar;
  undefined8 in_stack_ffffffffffffff78;
  int iVar6;
  _Alloc_hider in_stack_ffffffffffffff90;
  string local_50 [32];
  
  CreateFile(Size);
  iVar4 = (int)Size + -1;
  iVar6 = 0;
  lVar2 = std::chrono::_V2::system_clock::now();
  for (uVar5 = 0; uVar5 < 1000; uVar5 = uVar5 + 1) {
    std::__cxx11::string::string(local_50,(string *)&filename_abi_cxx11_);
    sVar1._M_string_length = lVar2;
    sVar1._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff78;
    sVar1.field_2._M_allocated_capacity._0_4_ = iVar6;
    sVar1.field_2._M_allocated_capacity._4_4_ = iVar4;
    sVar1.field_2._8_8_ = in_stack_ffffffffffffff90._M_p;
    (*ToBenchmark)((string *)&stack0xffffffffffffff90,sVar1);
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)&stack0xffffffffffffff88,&Generator);
    std::__cxx11::string::push_back(-0x50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string(local_50);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  return (lVar3 - lVar2) / 1000000;
}

Assistant:

uint64_t DoBenchmark(Function ToBenchmark, uint64_t Size)
{
    CreateFile(Size);
    std::uniform_int_distribution<> RandomChar(0,Size-1);
    auto start = std::chrono::high_resolution_clock::now();
    for(uint64_t Counter = 0; Counter < TestIterations; Counter++)
    {
        HardToOptimizeOutResultsStorage.push_back(
            ToBenchmark(filename)[RandomChar(Generator)]
        );
    }
    auto stop = std::chrono::high_resolution_clock::now();

    return std::chrono::duration_cast<std::chrono::milliseconds>(stop-start).count();
    CreateFile(0);
}